

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O3

void LoadBytes(AES_state *s,uchar *data16)

{
  int c;
  int r;
  int iVar1;
  byte bVar2;
  int i;
  long lVar3;
  
  c = 0;
  do {
    iVar1 = 0;
    do {
      bVar2 = *data16;
      lVar3 = 0;
      do {
        s->slice[lVar3] =
             s->slice[lVar3] | (ushort)(bVar2 & 1) << ((char)c + (char)iVar1 * '\x04' & 0x1fU);
        bVar2 = bVar2 >> 1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 8);
      data16 = data16 + 1;
      iVar1 = iVar1 + 1;
    } while (iVar1 != 4);
    c = c + 1;
  } while (c != 4);
  return;
}

Assistant:

static void LoadBytes(AES_state *s, const unsigned char* data16) {
    int c;
    for (c = 0; c < 4; c++) {
        int r;
        for (r = 0; r < 4; r++) {
            LoadByte(s, *(data16++), r, c);
        }
    }
}